

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  TestInfo *this;
  TestSuite *in_RSI;
  string *in_RDI;
  TestInfo *in_stack_00000070;
  char *in_stack_00000078;
  ostream *in_stack_00000080;
  int i;
  string kTestsuite;
  TestResult *in_stack_fffffffffffffbd8;
  TestSuite *in_stack_fffffffffffffbe0;
  int *in_stack_fffffffffffffbf8;
  allocator<char> *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  string *in_stack_fffffffffffffcb0;
  string *name;
  string *in_stack_fffffffffffffcb8;
  string *element_name;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  int local_2e0;
  allocator<char> local_2d9;
  string local_2d8 [32];
  string local_2b8 [24];
  string *in_stack_fffffffffffffd60;
  TestResult *in_stack_fffffffffffffd68;
  ostream *in_stack_fffffffffffffd70;
  TimeInMillis in_stack_fffffffffffffd88;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [36];
  int local_1d4;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [32];
  undefined4 in_stack_fffffffffffffe78;
  string local_180 [39];
  undefined1 local_159 [37];
  int local_134;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [36];
  int local_e4;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [16];
  TestResult *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  TestSuite *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  std::allocator<char>::~allocator(&local_31);
  poVar5 = std::operator<<((ostream *)local_8,"  <");
  std::operator<<(poVar5,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  TestSuite::name((TestSuite *)0x19e06c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  OutputXmlAttribute((ostream *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  local_e4 = TestSuite::reportable_test_count((TestSuite *)0x19e155);
  StreamableToString<int>(in_stack_fffffffffffffbf8);
  OutputXmlAttribute((ostream *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    iVar2 = TestSuite::failed_test_count((TestSuite *)0x19e22e);
    local_134 = iVar2;
    StreamableToString<int>(in_stack_fffffffffffffbf8);
    OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffcc0),
                       in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                       (string *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    element_name = (string *)local_159;
    name = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    iVar3 = TestSuite::reportable_disabled_test_count((TestSuite *)0x19e2fa);
    iVar4 = iVar3;
    StreamableToString<int>(in_stack_fffffffffffffbf8);
    OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffcc0),element_name,name,
                       (string *)CONCAT44(iVar3,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string((string *)(local_159 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    local_1d4 = TestSuite::skipped_test_count((TestSuite *)0x19e3c6);
    StreamableToString<int>(in_stack_fffffffffffffbf8);
    OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffcc0),element_name,name,
                       (string *)CONCAT44(iVar3,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffcc0),element_name,name,
                       (string *)CONCAT44(iVar3,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    TestSuite::elapsed_time(local_10);
    FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffd88);
    OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffcc0),element_name,name,
                       (string *)CONCAT44(iVar3,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    TestSuite::start_timestamp(local_10);
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_(CONCAT44(iVar4,in_stack_fffffffffffffe78));
    OutputXmlAttribute((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffcc0),element_name,name,
                       (string *)CONCAT44(iVar3,in_stack_fffffffffffffca8));
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
  }
  std::operator<<((ostream *)local_8,">\n");
  TestSuite::ad_hoc_test_result(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  OutputXmlTestProperties
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  for (local_2e0 = 0; iVar4 = TestSuite::total_test_count((TestSuite *)0x19eb1f), local_2e0 < iVar4;
      local_2e0 = local_2e0 + 1) {
    this = TestSuite::GetTestInfo
                     (in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
    bVar1 = TestInfo::is_reportable(this);
    if (bVar1) {
      TestSuite::name((TestSuite *)0x19eb7f);
      TestSuite::GetTestInfo
                (in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      OutputXmlTestInfo(in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
  }
  TestSuite::ad_hoc_test_result(local_10);
  bVar1 = TestResult::Failed(in_stack_fffffffffffffbd8);
  if (bVar1) {
    TestSuite::ad_hoc_test_result(local_10);
    OutputXmlTestCaseForTestResult(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  poVar5 = std::operator<<((ostream *)local_8,"  </");
  poVar5 = std::operator<<(poVar5,local_30);
  std::operator<<(poVar5,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestSuite(std::ostream* stream,
                                                 const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_suite.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_suite.reportable_test_count()));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_suite.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_suite.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "skipped",
                       StreamableToString(test_suite.skipped_test_count()));

    OutputXmlAttribute(stream, kTestsuite, "errors", "0");

    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_suite.elapsed_time()));
    OutputXmlAttribute(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsIso8601(test_suite.start_timestamp()));
  }
  *stream << ">\n";
  OutputXmlTestProperties(stream, test_suite.ad_hoc_test_result(),
                          /*indent=*/"    ");
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
  }
  if (test_suite.ad_hoc_test_result().Failed()) {
    OutputXmlTestCaseForTestResult(stream, test_suite.ad_hoc_test_result());
  }

  *stream << "  </" << kTestsuite << ">\n";
}